

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::HttpOutputStream::~HttpOutputStream(HttpOutputStream *this)

{
  HttpOutputStream *this_local;
  
  Promise<void>::~Promise(&this->writeQueue);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>);
  return;
}

Assistant:

HttpOutputStream(AsyncOutputStream& inner): inner(inner) {}